

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert(tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,time_point now,
           time_point expire_time)

{
  ulong uVar1;
  size_type sVar2;
  reference puVar3;
  iterator iVar4;
  reference e_00;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar5;
  element *e;
  iterator ttl_position;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
  keyed_position;
  unsigned_long element_idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  time_point expire_time_local;
  time_point now_local;
  
  uVar1 = this->m_used_size;
  this_local = (tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                *)expire_time.__d.__r;
  expire_time_local = now;
  sVar2 = std::
          vector<cappuccino::tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
          ::size(&this->m_elements);
  if (sVar2 <= uVar1) {
    do_prune(this,expire_time_local);
  }
  puVar3 = std::_List_iterator<unsigned_long>::operator*(&this->m_lru_end);
  keyed_position.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
             )*puVar3;
  pVar5 = std::
          unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::emplace<std::__cxx11::string_const&,unsigned_long&>
                    ((unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      *)&this->m_keyed_elements,key,(unsigned_long *)&keyed_position);
  iVar4 = std::
          multimap<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,unsigned_long,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
          ::
          emplace<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,unsigned_long&>
                    ((multimap<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,unsigned_long,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
                      *)&this->m_ttl_list,
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&this_local,(unsigned_long *)&keyed_position);
  e_00 = std::
         vector<cappuccino::tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
         ::operator[](&this->m_elements,
                      (size_type)
                      keyed_position.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                      ._M_cur);
  std::__cxx11::string::operator=((string *)&e_00->m_value,(string *)value);
  (e_00->m_expire_time).__d.__r = (rep)this_local;
  (e_00->m_lru_position)._M_node = (this->m_lru_end)._M_node;
  (e_00->m_ttl_position)._M_node = iVar4._M_node;
  (e_00->m_keyed_position).
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  ._M_cur = (__node_type *)
            pVar5.first.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  ;
  std::_List_iterator<unsigned_long>::operator++(&this->m_lru_end);
  this->m_used_size = this->m_used_size + 1;
  do_access(this,e_00);
  return;
}

Assistant:

auto do_insert(
        const key_type&                       key,
        value_type&&                          value,
        std::chrono::steady_clock::time_point now,
        std::chrono::steady_clock::time_point expire_time) -> void
    {
        // Inserts might require an item to be pruned, check that first before inserting the new key/value.
        if (m_used_size >= m_elements.size())
        {
            do_prune(now);
        }

        auto element_idx = *m_lru_end;

        auto keyed_position = m_keyed_elements.emplace(key, element_idx).first;

        // Insert the element_idx into the TTL list.
        auto ttl_position = m_ttl_list.emplace(expire_time, element_idx);

        // Update the element's appropriate fields across the datastructures.
        element& e         = m_elements[element_idx];
        e.m_value          = std::move(value);
        e.m_expire_time    = expire_time;
        e.m_lru_position   = m_lru_end;
        e.m_ttl_position   = ttl_position;
        e.m_keyed_position = keyed_position;

        // Update the LRU position.
        ++m_lru_end;

        ++m_used_size;

        do_access(e);
    }